

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mining.cpp
# Opt level: O0

UniValue * GetNetworkHashPS(int lookup,int height,CChain *active_chain)

{
  long lVar1;
  int iVar2;
  undefined8 uVar3;
  int64_t iVar4;
  long *plVar5;
  int in_EDX;
  int in_ESI;
  UniValue *in_RDI;
  long in_FS_OFFSET;
  int64_t timeDiff;
  int i;
  CBlockIndex *pb0;
  CBlockIndex *pb;
  int64_t time;
  int64_t maxTime;
  int64_t minTime;
  arith_uint256 workDiff;
  CChainParams *in_stack_fffffffffffffeb8;
  long *in_stack_fffffffffffffec0;
  CChain *in_stack_fffffffffffffec8;
  CChain *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  int iVar6;
  base_uint<256U> *in_stack_fffffffffffffee0;
  UniValue *this;
  char *in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff08;
  int in_stack_ffffffffffffff0c;
  CBlockIndex *local_e8;
  int local_c4;
  long local_a0;
  long local_98;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((in_ESI < -1) || (in_ESI == 0)) {
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff00,(allocator<char> *)in_RDI);
    JSONRPCError(in_stack_ffffffffffffff0c,(string *)in_RDI);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  else {
    this = in_RDI;
    if (-2 < in_EDX) {
      iVar6 = in_EDX;
      iVar2 = CChain::Height((CChain *)in_stack_fffffffffffffeb8);
      if (iVar6 <= iVar2) {
        local_e8 = CChain::Tip(in_stack_fffffffffffffec8);
        if (-1 < in_EDX) {
          local_e8 = CChain::operator[](in_stack_fffffffffffffed0,
                                        (int)((ulong)in_stack_fffffffffffffec8 >> 0x20));
        }
        if ((local_e8 == (CBlockIndex *)0x0) || (local_e8->nHeight == 0)) {
          UniValue::UniValue<int,_int,_true>(this,(int *)in_RDI);
        }
        else {
          local_c4 = in_ESI;
          if (in_ESI == -1) {
            in_stack_fffffffffffffec0 = (long *)(long)local_e8->nHeight;
            Params();
            CChainParams::GetConsensus(in_stack_fffffffffffffeb8);
            iVar4 = Consensus::Params::DifficultyAdjustmentInterval
                              (&in_stack_fffffffffffffeb8->consensus);
            local_c4 = (int)((long)in_stack_fffffffffffffec0 % iVar4) + 1;
          }
          if (local_e8->nHeight < local_c4) {
            local_c4 = local_e8->nHeight;
          }
          local_a0 = CBlockIndex::GetBlockTime((CBlockIndex *)in_stack_fffffffffffffeb8);
          local_98 = local_a0;
          for (iVar2 = 0; iVar2 < local_c4; iVar2 = iVar2 + 1) {
            CBlockIndex::GetBlockTime((CBlockIndex *)in_stack_fffffffffffffeb8);
            plVar5 = std::min<long>(in_stack_fffffffffffffec0,(long *)in_stack_fffffffffffffeb8);
            local_98 = *plVar5;
            plVar5 = std::max<long>(in_stack_fffffffffffffec0,(long *)in_stack_fffffffffffffeb8);
            local_a0 = *plVar5;
          }
          if (local_98 == local_a0) {
            UniValue::UniValue<int,_int,_true>(this,(int *)in_RDI);
          }
          else {
            operator-(in_stack_fffffffffffffee0,
                      (base_uint<256U> *)CONCAT44(iVar6,in_stack_fffffffffffffed8));
            arith_uint256::arith_uint256
                      ((arith_uint256 *)in_stack_fffffffffffffeb8,(base_uint<256U> *)0x61d60f);
            base_uint<256U>::getdouble((base_uint<256U> *)CONCAT44(iVar6,in_stack_fffffffffffffed8))
            ;
            UniValue::UniValue<double,_double,_true>(this,(double *)in_RDI);
          }
        }
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          return this;
        }
        goto LAB_0061d6a2;
      }
    }
    uVar3 = __cxa_allocate_exception(0x58);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
               in_stack_ffffffffffffff00,(allocator<char> *)this);
    JSONRPCError(in_stack_ffffffffffffff0c,(string *)this);
    if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
      __cxa_throw(uVar3,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
LAB_0061d6a2:
  __stack_chk_fail();
}

Assistant:

static UniValue GetNetworkHashPS(int lookup, int height, const CChain& active_chain) {
    if (lookup < -1 || lookup == 0) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Invalid nblocks. Must be a positive number or -1.");
    }

    if (height < -1 || height > active_chain.Height()) {
        throw JSONRPCError(RPC_INVALID_PARAMETER, "Block does not exist at specified height");
    }

    const CBlockIndex* pb = active_chain.Tip();

    if (height >= 0) {
        pb = active_chain[height];
    }

    if (pb == nullptr || !pb->nHeight)
        return 0;

    // If lookup is -1, then use blocks since last difficulty change.
    if (lookup == -1)
        lookup = pb->nHeight % Params().GetConsensus().DifficultyAdjustmentInterval() + 1;

    // If lookup is larger than chain, then set it to chain length.
    if (lookup > pb->nHeight)
        lookup = pb->nHeight;

    const CBlockIndex* pb0 = pb;
    int64_t minTime = pb0->GetBlockTime();
    int64_t maxTime = minTime;
    for (int i = 0; i < lookup; i++) {
        pb0 = pb0->pprev;
        int64_t time = pb0->GetBlockTime();
        minTime = std::min(time, minTime);
        maxTime = std::max(time, maxTime);
    }

    // In case there's a situation where minTime == maxTime, we don't want a divide by zero exception.
    if (minTime == maxTime)
        return 0;

    arith_uint256 workDiff = pb->nChainWork - pb0->nChainWork;
    int64_t timeDiff = maxTime - minTime;

    return workDiff.getdouble() / timeDiff;
}